

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O3

uint32_t NgramBuilder_add_word(NgramBuilder builder,char *words,uint32_t prob,uint32_t bow)

{
  uint32_t uVar1;
  char *pcVar2;
  size_t sVar3;
  byte local_48;
  uint32_t local_47;
  undefined1 auStack_43 [3];
  char encode_buff [20];
  
  uVar1 = HashVocab_add(builder->vocab,words);
  local_48 = (bow != 0) << 6 | 0x81;
  if (bow == 0) {
    sVar3 = 9;
  }
  else {
    sVar3 = 0xd;
    encode_buff._1_4_ = bow;
  }
  *builder->added_gram_nums = *builder->added_gram_nums + 1;
  local_47 = uVar1;
  _auStack_43 = prob;
  pcVar2 = _NgramBuilder_cp_str(builder,(char *)&local_48,sVar3);
  sVar3 = builder->added_total_gram_num;
  builder->added_total_gram_num = sVar3 + 1;
  builder->ngram_offsets[sVar3] = pcVar2;
  return uVar1;
}

Assistant:

uint32_t NgramBuilder_add_word(NgramBuilder builder, const char* words, uint32_t prob, uint32_t bow){
    //printf("%s ,prob:%d, bow:%d\n", words, prob, bow);
    uint32_t wid = HashVocab_add(builder->vocab, words);
    char encode_buff[20];//actually is 13
    uint32_t len = _encode_uni(wid, prob, bow, encode_buff);
    assert(len <= 20);
    builder->added_gram_nums[0]++;
    builder->ngram_offsets[builder->added_total_gram_num++] = _NgramBuilder_cp_str(builder, encode_buff, len);
    return wid;
}